

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O0

void Abc_XsimPrint(FILE *pFile,int Value)

{
  int Value_local;
  FILE *pFile_local;
  
  if (Value == 1) {
    fprintf((FILE *)pFile,"0");
  }
  else if (Value == 2) {
    fprintf((FILE *)pFile,"1");
  }
  else {
    if (Value != 3) {
      __assert_fail("Value == XVSX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                    ,0x5c,"void Abc_XsimPrint(FILE *, int)");
    }
    fprintf((FILE *)pFile,"x");
  }
  return;
}

Assistant:

static inline void Abc_XsimPrint( FILE * pFile, int Value )   
{ 
    if ( Value == XVS0 )
    {
        fprintf( pFile, "0" );
        return;
    }
    if ( Value == XVS1 )
    {
        fprintf( pFile, "1" );
        return;
    }
    assert( Value == XVSX );       
    fprintf( pFile, "x" );
}